

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

Vec_Int_t * Tim_ManAlignTwo(Tim_Man_t *pSpec,Tim_Man_t *pImpl)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  pVVar2 = pSpec->vBoxes;
  iVar5 = 0;
  iVar7 = 0;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    iVar7 = pVVar2->nSize;
  }
  pVVar3 = pImpl->vBoxes;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar5 = pVVar3->nSize;
  }
  if (iVar7 <= iVar5) {
    __assert_fail("Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                  ,0x160,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
  }
  uVar1 = pVVar3->nSize;
  if ((int)uVar1 < 1) {
    if (pVVar2 != (Vec_Ptr_t *)0x0) goto LAB_004a16c6;
    iVar7 = 0;
  }
  else {
    if (pVVar2 == (Vec_Ptr_t *)0x0) {
      return (Vec_Int_t *)0x0;
    }
    uVar8 = 0;
    do {
      iVar7 = *(int *)((long)pVVar3->pArray[uVar8] + 0x14);
      if (iVar7 < 0) {
        return (Vec_Int_t *)0x0;
      }
      if (pVVar2->nSize <= iVar7) {
        return (Vec_Int_t *)0x0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
LAB_004a16c6:
    iVar7 = pVVar2->nSize;
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar5 = iVar7;
  }
  pVVar6->nCap = iVar5;
  if (iVar5 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar7;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
    pVVar6->pArray = __s;
    pVVar6->nSize = iVar7;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar7 << 2);
      goto LAB_004a1737;
    }
  }
  __s = (int *)0x0;
LAB_004a1737:
  if (0 < (int)uVar1) {
    ppvVar4 = pVVar3->pArray;
    uVar8 = 0;
    do {
      iVar5 = *(int *)((long)ppvVar4[uVar8] + 0x14);
      lVar9 = (long)iVar5;
      if ((lVar9 < 0) || (iVar7 <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (__s[lVar9] != 0) {
        __assert_fail("!Vec_IntEntry(vBoxPres, pBox->iCopy)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                      ,0x169,"Vec_Int_t *Tim_ManAlignTwo(Tim_Man_t *, Tim_Man_t *)");
      }
      __s[lVar9] = 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar1);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Tim_ManAlignTwo( Tim_Man_t * pSpec, Tim_Man_t * pImpl )
{
    Vec_Int_t * vBoxPres;
    Tim_Box_t * pBox;
    int i;
    assert( Tim_ManBoxNum(pSpec) > Tim_ManBoxNum(pImpl) );
    // check if boxes of pImpl can be aligned
    Tim_ManForEachBox( pImpl, pBox, i )
        if ( pBox->iCopy < 0 || pBox->iCopy >= Tim_ManBoxNum(pSpec) ) 
            return NULL;
    // map dropped boxes into 1, others into 0
    vBoxPres = Vec_IntStart( Tim_ManBoxNum(pSpec) );
    Tim_ManForEachBox( pImpl, pBox, i )
    {
        assert( !Vec_IntEntry(vBoxPres, pBox->iCopy) );
        Vec_IntWriteEntry( vBoxPres, pBox->iCopy, 1 );
    }
    return vBoxPres;
}